

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

String * __thiscall
kj::
str<kj::StringPtr&,char_const(&)[3],unsigned_int&,char_const(&)[2],unsigned_int&,char_const(&)[3]>
          (String *__return_storage_ptr__,kj *this,StringPtr *params,char (*params_1) [3],
          uint *params_2,char (*params_3) [2],uint *params_4,char (*params_5) [3])

{
  StringPtr *value;
  char (*pacVar1) [3];
  kj *pkVar2;
  char (*value_00) [2];
  uint *value_01;
  uint *value_02;
  ArrayPtr<const_char> *in_stack_ffffffffffffff40;
  ArrayPtr<const_char> local_a8;
  CappedArray<char,_14UL> local_98;
  ArrayPtr<const_char> local_80;
  CappedArray<char,_14UL> local_70;
  ArrayPtr<const_char> local_58;
  ArrayPtr<const_char> local_48;
  char (*local_38) [2];
  uint *params_local_4;
  char (*params_local_3) [2];
  uint *params_local_2;
  char (*params_local_1) [3];
  StringPtr *params_local;
  
  local_38 = params_3;
  params_local_4 = params_2;
  params_local_3 = (char (*) [2])params_1;
  params_local_2 = (uint *)params;
  params_local_1 = (char (*) [3])this;
  params_local = (StringPtr *)__return_storage_ptr__;
  value = fwd<kj::StringPtr&>((StringPtr *)this);
  local_48 = toCharSequence<kj::StringPtr&>(value);
  pacVar1 = ::const((char (*) [3])params_local_2);
  local_58 = toCharSequence<char_const(&)[3]>(pacVar1);
  pkVar2 = (kj *)fwd<unsigned_int&>((uint *)params_local_3);
  toCharSequence<unsigned_int&>(&local_70,pkVar2,value_01);
  value_00 = ::const((char (*) [2])params_local_4);
  local_80 = toCharSequence<char_const(&)[2]>(value_00);
  pkVar2 = (kj *)fwd<unsigned_int&>((uint *)local_38);
  toCharSequence<unsigned_int&>(&local_98,pkVar2,value_02);
  pacVar1 = ::const((char (*) [3])params_4);
  local_a8 = toCharSequence<char_const(&)[3]>(pacVar1);
  _::
  concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(_ *)&local_48,&local_58,(ArrayPtr<const_char> *)&local_70,
             (CappedArray<char,_14UL> *)&local_80,(ArrayPtr<const_char> *)&local_98,
             (CappedArray<char,_14UL> *)&local_a8,in_stack_ffffffffffffff40);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}